

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtimer.cpp
# Opt level: O3

void QTimer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QUntypedPropertyData *data;
  parameter_type *ppVar1;
  int *piVar2;
  QObjectData *pQVar3;
  QBindingStatus *pQVar4;
  undefined1 uVar5;
  int iVar6;
  QBindableInterface *pQVar7;
  long *plVar8;
  long in_FS_OFFSET;
  undefined1 local_29;
  void *local_28;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_28 = (void *)0x0;
      local_20 = &local_29;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
      goto switchD_002c92d0_caseD_3;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        start((QTimer *)_o,(milliseconds)(long)*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        start((QTimer *)_o);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        stop((QTimer *)_o);
        return;
      }
      break;
    default:
      goto switchD_002c92d0_caseD_3;
    }
    goto LAB_002c957b;
  case ReadProperty:
    if (4 < (uint)_id) break;
    piVar2 = (int *)*_a;
    switch(_id) {
    case 0:
      pQVar3 = (_o->d_ptr).d;
      pQVar4 = (pQVar3->bindingStorage).bindingStatus;
      if ((pQVar4 != (QBindingStatus *)0x0) &&
         (pQVar4->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper
                  (&pQVar3->bindingStorage,(QUntypedPropertyData *)&pQVar3[1].metaObject);
      }
      uVar5 = *(undefined1 *)&pQVar3[1].metaObject;
      goto LAB_002c951d;
    case 1:
      iVar6 = QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
                       *)((long)&(_o->d_ptr).d[1].children.d.size + 4));
      break;
    case 2:
      iVar6 = remainingTime((QTimer *)_o);
      break;
    case 3:
      pQVar3 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)((long)&pQVar3[1].metaObject + 4);
      pQVar4 = (pQVar3->bindingStorage).bindingStatus;
      if ((pQVar4 != (QBindingStatus *)0x0) &&
         (pQVar4->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(&pQVar3->bindingStorage,data);
      }
      iVar6 = *(int *)data;
      break;
    case 4:
      uVar5 = isActive((QTimer *)_o);
LAB_002c951d:
      *(undefined1 *)piVar2 = uVar5;
      goto switchD_002c92d0_caseD_3;
    }
    *piVar2 = iVar6;
    break;
  case WriteProperty:
    ppVar1 = (parameter_type *)*_a;
    if (_id == 3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
        ::setValue((QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
                    *)((long)&(_o->d_ptr).d[1].metaObject + 4),*ppVar1);
        return;
      }
      goto LAB_002c957b;
    }
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setInterval((QTimer *)_o,(milliseconds)(long)(int)*ppVar1);
        return;
      }
      goto LAB_002c957b;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>
        ::setValue((QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>
                    *)&(_o->d_ptr).d[1].metaObject,SUB41(*ppVar1,0));
        return;
      }
      goto LAB_002c957b;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == timeout) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    break;
  case BindableProperty:
    switch(_id) {
    case 0:
      plVar8 = (long *)*_a;
      *plVar8 = (long)&(_o->d_ptr).d[1].metaObject;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>,_void>
                ::iface;
      break;
    case 1:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[1].children.d.size + 4);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    default:
      goto switchD_002c92d0_caseD_3;
    case 3:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[1].metaObject + 4);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>,_void>
                ::iface;
      break;
    case 4:
      plVar8 = (long *)*_a;
      *plVar8 = (long)&(_o->d_ptr).d[1].bindingStorage;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>,_void>
                ::iface;
    }
    plVar8[1] = (long)pQVar7;
  }
switchD_002c92d0_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_002c957b:
  __stack_chk_fail();
}

Assistant:

void QTimer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->timeout(QPrivateSignal()); break;
        case 1: _t->start((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->start(); break;
        case 3: _t->stop(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimer::*)(QPrivateSignal)>(_a, &QTimer::timeout, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isSingleShot(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->interval(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->remainingTime(); break;
        case 3: *reinterpret_cast<Qt::TimerType*>(_v) = _t->timerType(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isActive(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSingleShot(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setInterval(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setTimerType(*reinterpret_cast<Qt::TimerType*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSingleShot(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableInterval(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableTimerType(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableActive(); break;
        default: break;
        }
    }
}